

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O0

GLFWglproc getProcAddressEGL(char *procname)

{
  void *pvVar1;
  char *in_RDI;
  GLFWglproc proc;
  _GLFWwindow *window;
  GLFWglproc local_8;
  
  pvVar1 = _glfwPlatformGetTls((_GLFWtls *)0x3bc3fc);
  if ((*(long *)((long)pvVar1 + 0x2a0) == 0) ||
     (local_8 = (GLFWglproc)dlsym(*(undefined8 *)((long)pvVar1 + 0x2a0),in_RDI),
     local_8 == (GLFWglproc)0x0)) {
    local_8 = (*_glfw.egl.GetProcAddress)(in_RDI);
  }
  return local_8;
}

Assistant:

static GLFWglproc getProcAddressEGL(const char* procname)
{
    _GLFWwindow* window = _glfwPlatformGetTls(&_glfw.contextSlot);

    if (window->context.egl.client)
    {
        GLFWglproc proc = (GLFWglproc) _glfw_dlsym(window->context.egl.client,
                                                   procname);
        if (proc)
            return proc;
    }

    return eglGetProcAddress(procname);
}